

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  Node *node;
  bool bVar1;
  Node *pNVar2;
  size_type sVar3;
  size_type sVar4;
  Tree *tree;
  TreeIterator local_30;
  
  local_30._M_node = (_Base_ptr)0x0;
  bVar1 = iterator_base<google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::KeyValuePair>
          ::revalidate_if_necessary(&it,&local_30);
  sVar3 = it.bucket_index_;
  node = it.node_;
  pNVar2 = (Node *)this->table_[it.bucket_index_];
  if (bVar1) {
    pNVar2 = EraseFromLinkedList(this,it.node_,pNVar2);
    sVar4 = sVar3;
  }
  else {
    std::
    _Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
    ::erase((_Rb_tree<google::protobuf::MapKey_*,_google::protobuf::MapKey_*,_std::_Identity<google::protobuf::MapKey_*>,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::KeyCompare,_google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::MapAllocator<google::protobuf::MapKey_*>_>
             *)pNVar2,(key_type *)(local_30._M_node + 1));
    if (pNVar2[1].kv.v_ != (value_type *)0x0) goto LAB_00271511;
    sVar4 = sVar3 & 0xfffffffffffffffe;
    DestroyTree(this,(Tree *)pNVar2);
    *(undefined8 *)((long)this->table_ + (sVar3 << 3 | 8)) = 0;
    pNVar2 = (Node *)0x0;
  }
  this->table_[sVar4] = pNVar2;
  sVar3 = sVar4;
LAB_00271511:
  DestroyNode(this,node);
  this->num_elements_ = this->num_elements_ - 1;
  if (sVar3 == this->index_of_first_non_null_) {
    while ((sVar3 < this->num_buckets_ && (this->table_[sVar3] == (void *)0x0))) {
      sVar3 = sVar3 + 1;
      this->index_of_first_non_null_ = sVar3;
    }
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(*tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = NULL;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == NULL) {
          ++index_of_first_non_null_;
        }
      }
    }